

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

void __thiscall
chaiscript::ChaiScript_Basic::register_namespace
          (ChaiScript_Basic *this,
          function<void_(chaiscript::dispatch::Dynamic_Object_&)> *t_namespace_generator,
          string *t_namespace_name)

{
  undefined8 __x;
  size_type sVar1;
  runtime_error *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>_>_>,_bool>
  pVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  _Base_ptr local_168;
  undefined1 local_160;
  anon_class_120_2_ba9586a2_for_second local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_include_chaiscript_language_chaiscript_engine_hpp:699:73)>
  local_d8;
  undefined1 local_30 [8];
  unique_lock<chaiscript::detail::threading::recursive_mutex> l;
  string *t_namespace_name_local;
  function<void_(chaiscript::dispatch::Dynamic_Object_&)> *t_namespace_generator_local;
  ChaiScript_Basic *this_local;
  
  l._8_8_ = t_namespace_name;
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)local_30,&this->m_use_mutex);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>_>_>_>
          ::count(&this->m_namespace_generators,(key_type *)l._8_8_);
  __x = l._8_8_;
  if (sVar1 == 0) {
    local_158.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_158.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_158.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_158.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_158.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_158.space.m_option_explicit = false;
    local_158.space._33_7_ = 0;
    local_158.space.m_attrs._M_t._M_impl._0_8_ = 0;
    local_158.space.m_type_name.field_2._M_allocated_capacity = 0;
    local_158.space.m_type_name.field_2._8_8_ = 0;
    local_158.space.m_type_name._M_dataplus._M_p = (pointer)0x0;
    local_158.space.m_type_name._M_string_length = 0;
    local_158.space.m_attrs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    dispatch::Dynamic_Object::Dynamic_Object(&local_158.space);
    std::function<void_(chaiscript::dispatch::Dynamic_Object_&)>::function
              (&local_158.t_namespace_generator,t_namespace_generator);
    std::
    make_pair<std::__cxx11::string_const&,chaiscript::ChaiScript_Basic::register_namespace(std::function<void(chaiscript::dispatch::Dynamic_Object&)>const&,std::__cxx11::string_const&)::_lambda()_1_>
              (&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
               &local_158);
    pVar2 = std::
            map<std::__cxx11::string,std::function<chaiscript::dispatch::Dynamic_Object&()>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<chaiscript::dispatch::Dynamic_Object&()>>>>
            ::
            emplace<std::pair<std::__cxx11::string,chaiscript::ChaiScript_Basic::register_namespace(std::function<void(chaiscript::dispatch::Dynamic_Object&)>const&,std::__cxx11::string_const&)::_lambda()_1_>>
                      ((map<std::__cxx11::string,std::function<chaiscript::dispatch::Dynamic_Object&()>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<chaiscript::dispatch::Dynamic_Object&()>>>>
                        *)&this->m_namespace_generators,&local_d8);
    local_168 = (_Base_ptr)pVar2.first._M_node;
    local_160 = pVar2.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_engine.hpp:699:73)>
    ::~pair(&local_d8);
    register_namespace(std::function<void(chaiscript::dispatch::Dynamic_Object&)>const&,std::__cxx11::string_const&)
    ::{lambda()#1}::~basic_string((_lambda___1_ *)&local_158);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_30);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_1a8,"Namespace: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l._8_8_);
  std::operator+(&local_188,&local_1a8," was already registered.");
  std::runtime_error::runtime_error(this_00,(string *)&local_188);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void register_namespace(const std::function<void(Namespace &)> &t_namespace_generator, const std::string &t_namespace_name) {
      chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);

      if (!m_namespace_generators.count(t_namespace_name)) {
        // contain the namespace object memory within the m_namespace_generators map
        m_namespace_generators.emplace(std::make_pair(t_namespace_name, [=, space = Namespace()]() mutable -> Namespace & {
          t_namespace_generator(space);
          return space;
        }));
      } else {
        throw std::runtime_error("Namespace: " + t_namespace_name + " was already registered.");
      }
    }